

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O2

void narrow_thin_box(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color FVar1;
  uchar *puVar2;
  uint uVar3;
  
  if (0 < w && 0 < h) {
    puVar2 = fl_gray_ramp();
    FVar1 = shade_color(puVar2[0x52],c);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])();
    FVar1 = shade_color(puVar2[0x49],c);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
    if (1 < (uint)w) {
      uVar3 = w + -2 + x;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,(ulong)(x + 1U),y,(ulong)uVar3);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,(ulong)(x + 1U),(ulong)((h + y) - 1),(ulong)uVar3);
    }
    if (1 < (uint)h) {
      uVar3 = h + -2 + y;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                (fl_graphics_driver,(ulong)(uint)x,(ulong)(y + 1U),(ulong)uVar3);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                (fl_graphics_driver,(ulong)((w + x) - 1),(ulong)(y + 1U),(ulong)uVar3);
      return;
    }
  }
  return;
}

Assistant:

static void narrow_thin_box(int x, int y, int w, int h, Fl_Color c) {
  if (h<=0 || w<=0) return;
  const uchar *g = fl_gray_ramp();
  fl_color(shade_color(g[(int)'R'], c));
  fl_rectf(x+1, y+1, w-2, h-2);
  fl_color(shade_color(g[(int)'I'], c));
  if (w > 1) {
    fl_xyline(x+1, y, x+w-2);
    fl_xyline(x+1, y+h-1, x+w-2);
  }
  if (h > 1) {
    fl_yxline(x, y+1, y+h-2);
    fl_yxline(x+w-1, y+1, y+h-2);
  }
}